

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  undefined1 auVar3 [64];
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m256 _p_1;
  __m512 _outp;
  __m512 _b;
  __m512 _p;
  int i;
  binary_op_div op;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_2b4;
  float *local_2a8;
  undefined1 (*local_2a0) [64];
  undefined1 (*local_298) [64];
  
  local_2a8 = in_RDX;
  local_2a0 = in_RSI;
  local_298 = in_RDI;
  for (local_2b4 = 0; local_2b4 + 0xf < in_ECX; local_2b4 = local_2b4 + 0x10) {
    auVar3 = vdivps_avx512f(*local_298,*local_2a0);
    local_380 = auVar3._0_8_;
    uStack_378 = auVar3._8_8_;
    uStack_370 = auVar3._16_8_;
    uStack_368 = auVar3._24_8_;
    uStack_360 = auVar3._32_8_;
    uStack_358 = auVar3._40_8_;
    uStack_350 = auVar3._48_8_;
    uStack_348 = auVar3._56_8_;
    *(undefined8 *)local_2a8 = local_380;
    *(undefined8 *)(local_2a8 + 2) = uStack_378;
    *(undefined8 *)(local_2a8 + 4) = uStack_370;
    *(undefined8 *)(local_2a8 + 6) = uStack_368;
    *(undefined8 *)(local_2a8 + 8) = uStack_360;
    *(undefined8 *)(local_2a8 + 10) = uStack_358;
    *(undefined8 *)(local_2a8 + 0xc) = uStack_350;
    *(undefined8 *)(local_2a8 + 0xe) = uStack_348;
    local_298 = local_298 + 1;
    local_2a0 = local_2a0 + 1;
    local_2a8 = local_2a8 + 0x10;
  }
  for (; local_2b4 + 7 < in_ECX; local_2b4 = local_2b4 + 8) {
    auVar2 = vdivps_avx(*(undefined1 (*) [32])*local_298,*(undefined1 (*) [32])*local_2a0);
    local_3e0 = auVar2._0_8_;
    uStack_3d8 = auVar2._8_8_;
    uStack_3d0 = auVar2._16_8_;
    uStack_3c8 = auVar2._24_8_;
    *(undefined8 *)local_2a8 = local_3e0;
    *(undefined8 *)(local_2a8 + 2) = uStack_3d8;
    *(undefined8 *)(local_2a8 + 4) = uStack_3d0;
    *(undefined8 *)(local_2a8 + 6) = uStack_3c8;
    local_298 = (undefined1 (*) [64])(*local_298 + 0x20);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 0x20);
    local_2a8 = local_2a8 + 8;
  }
  for (; local_2b4 + 3 < in_ECX; local_2b4 = local_2b4 + 4) {
    auVar1 = vdivps_avx(*(undefined1 (*) [16])*local_298,*(undefined1 (*) [16])*local_2a0);
    local_410 = auVar1._0_8_;
    uStack_408 = auVar1._8_8_;
    *(undefined8 *)local_2a8 = local_410;
    *(undefined8 *)(local_2a8 + 2) = uStack_408;
    local_298 = (undefined1 (*) [64])(*local_298 + 0x10);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 0x10);
    local_2a8 = local_2a8 + 4;
  }
  for (; local_2b4 < in_ECX; local_2b4 = local_2b4 + 1) {
    *local_2a8 = *(float *)*local_298 / *(float *)*local_2a0;
    local_298 = (undefined1 (*) [64])(*local_298 + 4);
    local_2a0 = (undefined1 (*) [64])(*local_2a0 + 4);
    local_2a8 = local_2a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}